

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O0

int Hop_ManCountLevels(Hop_Man_t *p)

{
  anon_union_8_2_00a17ec8_for_Hop_Obj_t__0 aVar1;
  anon_union_8_2_00a17ec8_for_Hop_Obj_t__0 aVar2;
  int iVar3;
  int iVar4;
  Hop_Obj_t *pHVar5;
  undefined8 *puVar6;
  Vec_Ptr_t *p_00;
  Hop_Obj_t *pHVar7;
  int Level1;
  int Level0;
  int LevelsMax;
  int i;
  Hop_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Hop_Man_t *p_local;
  
  pHVar5 = Hop_ManConst1(p);
  (pHVar5->field_0).pData = (void *)0x0;
  for (Level0 = 0; iVar3 = Vec_PtrSize(p->vPis), Level0 < iVar3; Level0 = Level0 + 1) {
    puVar6 = (undefined8 *)Vec_PtrEntry(p->vPis,Level0);
    *puVar6 = 0;
  }
  p_00 = Hop_ManDfs(p);
  for (Level0 = 0; iVar3 = Vec_PtrSize(p_00), Level0 < iVar3; Level0 = Level0 + 1) {
    pHVar5 = (Hop_Obj_t *)Vec_PtrEntry(p_00,Level0);
    pHVar7 = Hop_ObjFanin0(pHVar5);
    aVar1 = pHVar7->field_0;
    pHVar7 = Hop_ObjFanin1(pHVar5);
    aVar2 = pHVar7->field_0;
    iVar3 = Hop_ObjIsExor(pHVar5);
    iVar4 = Abc_MaxInt(aVar1.iData,aVar2.iData);
    pHVar5->field_0 = (anon_union_8_2_00a17ec8_for_Hop_Obj_t__0)(long)(iVar3 + 1 + iVar4);
  }
  Vec_PtrFree(p_00);
  Level1 = 0;
  for (Level0 = 0; iVar3 = Vec_PtrSize(p->vPos), Level0 < iVar3; Level0 = Level0 + 1) {
    pHVar5 = (Hop_Obj_t *)Vec_PtrEntry(p->vPos,Level0);
    pHVar5 = Hop_ObjFanin0(pHVar5);
    Level1 = Abc_MaxInt(Level1,(pHVar5->field_0).iData);
  }
  return Level1;
}

Assistant:

int Hop_ManCountLevels( Hop_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Hop_Obj_t * pObj;
    int i, LevelsMax, Level0, Level1;
    // initialize the levels
    Hop_ManConst1(p)->pData = NULL;
    Hop_ManForEachPi( p, pObj, i )
        pObj->pData = NULL;
    // compute levels in a DFS order
    vNodes = Hop_ManDfs( p );
    Vec_PtrForEachEntry( Hop_Obj_t *, vNodes, pObj, i )
    {
        Level0 = (int)(ABC_PTRUINT_T)Hop_ObjFanin0(pObj)->pData;
        Level1 = (int)(ABC_PTRUINT_T)Hop_ObjFanin1(pObj)->pData;
        pObj->pData = (void *)(ABC_PTRUINT_T)(1 + Hop_ObjIsExor(pObj) + Abc_MaxInt(Level0, Level1));
    }
    Vec_PtrFree( vNodes );
    // get levels of the POs
    LevelsMax = 0;
    Hop_ManForEachPo( p, pObj, i )
        LevelsMax = Abc_MaxInt( LevelsMax, (int)(ABC_PTRUINT_T)Hop_ObjFanin0(pObj)->pData );
    return LevelsMax;
}